

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.h
# Opt level: O0

cmCommand * __thiscall cmProjectCommand::Clone(cmProjectCommand *this)

{
  cmCommand *this_00;
  cmProjectCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmProjectCommand((cmProjectCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmProjectCommand; }